

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_client.cc
# Opt level: O0

void __thiscall common::SSH2Client::Login(SSH2Client *this)

{
  int iVar1;
  int iVar2;
  Log *pLVar3;
  LIBSSH2_CHANNEL *pLVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  bool bVar7;
  int n;
  int ret;
  fd_set *__arr;
  undefined1 local_7eb8 [4];
  uint __i;
  fd_set set;
  timeval timeval_out;
  char buffer [32000];
  LIBSSH2_POLLFD *fds;
  LIBSSH2_POLLFD fdp;
  unsigned_short uStack_f0;
  winsize w_size_bck;
  winsize w_size;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  SSH2Client *local_10;
  SSH2Client *this_local;
  
  local_10 = this;
  pLVar3 = xlib::Log::Instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"[%v@%v:%v %v]\n",&local_31);
  xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string,unsigned_short,std::__cxx11::string>
            (pLVar3,LOG_PRIORITY_INFO,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
             ,0x142,"Login",false,(string *)local_30,&this->m_user,&this->m_ip,&this->m_port,
             &this->m_alias);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  while( true ) {
    pLVar4 = libssh2_channel_open_ex(this->session,"session",7,0x200000,0x8000,(char *)0x0,0);
    this->channel = pLVar4;
    bVar7 = false;
    if (pLVar4 == (LIBSSH2_CHANNEL *)0x0) {
      iVar1 = libssh2_session_last_error(this->session,(char **)0x0,(int *)0x0,0);
      bVar7 = iVar1 == -0x25;
    }
    if (!bVar7) break;
    waitsocket(this->sock,this->session);
  }
  if (this->channel == (LIBSSH2_CHANNEL *)0x0) {
    pLVar3 = xlib::Log::Instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"channel null",&local_69);
    xlib::Log::SWrite<>(pLVar3,LOG_PRIORITY_FATAL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                        ,0x149,"Login",true,(string *)local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    exit(1);
  }
  iVar1 = libssh2_channel_request_pty_ex(this->channel,"xterm",5,(char *)0x0,0,0x50,0x18,0,0);
  if (iVar1 != 0) {
    pLVar3 = xlib::Log::Instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"request pty fail",&local_91);
    xlib::Log::SWrite<>(pLVar3,LOG_PRIORITY_FATAL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                        ,0x14e,"Login",true,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    exit(1);
  }
  iVar1 = libssh2_channel_process_startup(this->channel,"shell",5,(char *)0x0,0);
  if (iVar1 == 0) {
    iVar1 = RawMode(this);
    this->rc = iVar1;
    if (this->rc == 0) {
      memset(&w_size_bck,0,8);
      memset((void *)((long)&fdp.revents + 6),0,8);
      iVar1 = fileno(_stdin);
      ioctl(iVar1,0x5413,&w_size_bck);
      if ((w_size_bck.ws_row != fdp.revents._6_2_) || (w_size_bck.ws_col != uStack_f0)) {
        libssh2_channel_request_pty_size_ex
                  (this->channel,(uint)w_size_bck.ws_col,(uint)w_size_bck.ws_row,0,0);
      }
      fds._0_1_ = 2;
      fdp._0_8_ = this->channel;
      fdp.fd = (anon_union_8_3_a559ac02_for_fd)0x1;
      set.fds_bits[0xf] = 0;
      timeval_out.tv_sec = 0x32;
      do {
        do {
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            set.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
          }
          iVar1 = fileno(_stdin);
          iVar2 = fileno(_stdin);
          set.fds_bits[(long)(iVar2 / 0x40) + -1] =
               1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | set.fds_bits[(long)(iVar2 / 0x40) + -1];
          iVar1 = fileno(_stdin);
          iVar1 = select(iVar1 + 1,(fd_set *)local_7eb8,(fd_set *)0x0,(fd_set *)0x0,
                         (timeval *)(set.fds_bits + 0xf));
          this->rc = iVar1;
          if (0 < this->rc) {
            iVar1 = fileno(_stdin);
            sVar5 = read(iVar1,&timeval_out.tv_usec,32000);
            this->rc = (int)sVar5;
            if (0 < this->rc) {
              do {
                sVar6 = libssh2_channel_write_ex
                                  (this->channel,0,(char *)&timeval_out.tv_usec,(long)this->rc);
              } while ((int)sVar6 == -0x25);
            }
          }
          iVar1 = libssh2_poll((LIBSSH2_POLLFD *)&fds,1,0);
          this->rc = iVar1;
        } while (this->rc < 1);
        if ((fdp.events & 1) != 0) {
          sVar6 = libssh2_channel_read_ex(this->channel,0,(char *)&timeval_out.tv_usec,32000);
          write(1,&timeval_out.tv_usec,(long)(int)sVar6);
          fflush(_stdout);
        }
      } while ((fdp.events & 0x80) == 0);
      NormalMode(this);
      return;
    }
    pLVar3 = xlib::Log::Instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&w_size.ws_col,"raw mode error",(allocator *)((long)&w_size.ws_row + 1));
    xlib::Log::SWrite<>(pLVar3,LOG_PRIORITY_FATAL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                        ,0x155,"Login",true,(string *)&w_size.ws_col);
    std::__cxx11::string::~string((string *)&w_size.ws_col);
    std::allocator<char>::~allocator((allocator<char> *)((long)&w_size.ws_row + 1));
    exit(1);
  }
  pLVar3 = xlib::Log::Instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"open shell fail",&local_b9);
  xlib::Log::SWrite<>(pLVar3,LOG_PRIORITY_FATAL,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/ssh2_client.cc"
                      ,0x151,"Login",true,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  exit(1);
}

Assistant:

void SSH2Client::Login() {
    XLOG("[%v@%v:%v %v]\n", m_user,  m_ip, m_port, m_alias);
    /* Exec non-blocking on the remove host */
    while ( (channel = libssh2_channel_open_session(session)) == NULL &&
           libssh2_session_last_error(session, NULL, NULL, 0) ==
           LIBSSH2_ERROR_EAGAIN ) {
        waitsocket(sock, session);
    }
    IF_XFATAL(channel == NULL, "channel null");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options
     */
    IF_XFATAL(libssh2_channel_request_pty(channel, "xterm"), "request pty fail");

    /* Open a SHELL on that pty */
    IF_XFATAL(libssh2_channel_shell(channel), "open shell fail");


    rc = RawMode();
    IF_XFATAL(rc != 0, "raw mode error");

    struct winsize w_size;
    struct winsize w_size_bck;
    memset(&w_size, 0, sizeof(struct winsize));
    memset(&w_size_bck, 0, sizeof(struct winsize));
    ioctl(fileno(stdin), TIOCGWINSZ, &w_size);
    if ((w_size.ws_row != w_size_bck.ws_row) ||
        (w_size.ws_col != w_size_bck.ws_col))   {
        w_size_bck = w_size;

        libssh2_channel_request_pty_size(channel,
                                         w_size.ws_col,
                                         w_size.ws_row);
    }

    LIBSSH2_POLLFD fdp;
    LIBSSH2_POLLFD* fds = &fdp;
    fds[0].type = LIBSSH2_POLLFD_CHANNEL;
    fds[0].fd.channel = channel;
    fds[0].events = LIBSSH2_POLLFD_POLLIN;

    char buffer[32000];

    struct timeval timeval_out;
    timeval_out.tv_sec = 0;
    timeval_out.tv_usec = 50;

    fd_set set;

    while (1) {
        FD_ZERO(&set);
        FD_SET(fileno(stdin), &set);

        rc = select(fileno(stdin)+1, &set, NULL, NULL, &timeval_out);
        if (rc > 0) {
            rc = read(fileno(stdin), buffer, sizeof(buffer));
            if (rc > 0) {
                int ret;
                while ((ret = libssh2_channel_write(channel, buffer, rc)) == LIBSSH2_ERROR_EAGAIN) {}
            }
        }
        rc = libssh2_poll(fds, 1, 0);
        if (rc < 1)
            continue;

        if (fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
            int n = libssh2_channel_read(channel, buffer, sizeof(buffer));
            write(1, buffer, n);
            fflush(stdout);
        }

        if (fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
            // fprintf(stdout, "%s\n", "closed");
            break;
        }
    }
    NormalMode();
}